

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfgmr.c
# Opt level: O2

int sfgmr(int n,_func_void_float_float_ptr_float_float_ptr *smatvec,
         _func_void_int_float_ptr_float_ptr *spsolve,float *rhs,float *sol,double tol,int im,
         int *itmax,FILE *fits)

{
  undefined8 uVar1;
  bool bVar2;
  long *addr;
  float *pfVar3;
  void *addr_00;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int i_2;
  float *pfVar7;
  int j;
  double dVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int i;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  size_t n_00;
  real rVar16;
  float fVar17;
  float fVar18;
  int n_local;
  uint local_dc;
  void *local_d8;
  float local_cc;
  double local_c8;
  float negt;
  float *local_b8;
  uint local_ac;
  ulong local_a8;
  ulong local_a0;
  undefined1 local_98 [16];
  double local_88;
  _func_void_float_float_ptr_float_float_ptr *local_80;
  uint local_74;
  float local_70;
  int i_1;
  size_t local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  _func_void_int_float_ptr_float_ptr *local_40;
  void *local_38;
  
  local_a8 = (ulong)(uint)*itmax;
  i_1 = 1;
  n_00 = (size_t)im;
  n_local = n;
  local_ac = im;
  local_88 = tol;
  local_80 = smatvec;
  local_60 = rhs;
  local_58 = sol;
  local_40 = spsolve;
  addr = (long *)superlu_malloc(n_00 * 8 + 8);
  for (lVar14 = 0; lVar14 <= (long)n_00; lVar14 = lVar14 + 1) {
    pfVar3 = floatMalloc((long)n);
    addr[lVar14] = (long)pfVar3;
  }
  addr_00 = superlu_malloc(n_00 * 8);
  local_d8 = superlu_malloc(n_00 * 8);
  uVar15 = 0;
  local_a0 = 0;
  if (0 < im) {
    local_a0 = (ulong)local_ac;
  }
  for (; local_a0 != uVar15; uVar15 = uVar15 + 1) {
    pfVar3 = floatMalloc(uVar15 + 2);
    *(float **)((long)local_d8 + uVar15 * 8) = pfVar3;
    pfVar3 = floatMalloc((long)n);
    *(float **)((long)addr_00 + uVar15 * 8) = pfVar3;
  }
  local_48 = floatMalloc(n_00);
  local_50 = floatMalloc(n_00);
  local_b8 = floatMalloc(n_00 + 1);
  local_74 = (int)local_a8 + 10;
  local_cc = 0.0;
  local_dc = 0;
  pfVar7 = local_58;
  pfVar3 = local_60;
  local_68 = n_00;
  local_38 = addr_00;
  while( true ) {
    (*local_80)(1.0,pfVar7,0.0,(float *)*addr);
    uVar15 = (ulong)(uint)n_local;
    if (n_local < 1) {
      uVar15 = 0;
    }
    for (uVar5 = 0; uVar15 != uVar5; uVar5 = uVar5 + 1) {
      *(float *)(*addr + uVar5 * 4) = pfVar3[uVar5] - *(float *)(*addr + uVar5 * 4);
    }
    rVar16 = snrm2_(&n_local,(real *)*addr,&i_1);
    local_98._0_4_ = rVar16;
    local_c8 = (double)rVar16;
    if ((fits != (FILE *)0x0) && (local_dc == 0)) {
      fprintf((FILE *)fits,"%8d   %10.2e\n",local_c8,0);
    }
    rVar16 = snrm2_(&n_local,pfVar3,&i_1);
    uVar13 = local_dc;
    if (local_c8 <= (double)rVar16 * local_88) break;
    uVar15 = (ulong)(uint)n_local;
    if (n_local < 1) {
      uVar15 = 0;
    }
    for (uVar5 = 0; uVar15 != uVar5; uVar5 = uVar5 + 1) {
      *(float *)(*addr + uVar5 * 4) = *(float *)(*addr + uVar5 * 4) * (1.0 / (float)local_98._0_4_);
    }
    if (local_dc == 0) {
      local_cc = (float)(local_c8 * local_88);
    }
    *local_b8 = (float)local_98._0_4_;
    local_c8 = 4.94065645841247e-324;
    uVar15 = 0;
    do {
      uVar5 = local_a0;
      if (uVar15 == local_a0) break;
      if (local_40 == (_func_void_int_float_ptr_float_ptr *)0x0) {
        scopy_(&n_local,(real *)addr[uVar15],&i_1,*(real **)((long)addr_00 + uVar15 * 8),&i_1);
      }
      else {
        (*local_40)(n_local,*(float **)((long)addr_00 + uVar15 * 8),(float *)addr[uVar15]);
      }
      local_dc = local_dc + 1;
      uVar10 = uVar15 + 1;
      (*local_80)(1.0,*(float **)((long)addr_00 + uVar15 * 8),0.0,(float *)addr[uVar10]);
      rVar16 = snrm2_(&n_local,(real *)addr[uVar10],&i_1);
      local_98._0_4_ = rVar16;
      for (dVar8 = 0.0; local_c8 != dVar8; dVar8 = (double)((long)dVar8 + 1)) {
        rVar16 = sdot_(&n_local,(real *)addr[(long)dVar8],&i_1,(real *)addr[uVar10],&i_1);
        *(real *)(*(long *)((long)local_d8 + uVar15 * 8) + (long)dVar8 * 4) = rVar16;
        negt = -rVar16;
        saxpy_(&n_local,&negt,(real *)addr[(long)dVar8],&i_1,(real *)addr[uVar10],&i_1);
        rVar16 = (real)local_98._0_4_;
      }
      while( true ) {
        local_70 = rVar16;
        rVar16 = snrm2_(&n_local,(real *)addr[uVar10],&i_1);
        addr_00 = local_38;
        local_98._0_4_ = rVar16;
        if (local_70 * 0.5 <= rVar16) break;
        for (dVar8 = 0.0; local_c8 != dVar8; dVar8 = (double)((long)dVar8 + 1)) {
          rVar16 = sdot_(&n_local,(real *)addr[(long)dVar8],&i_1,(real *)addr[uVar10],&i_1);
          lVar14 = *(long *)((long)local_d8 + uVar15 * 8);
          *(float *)(lVar14 + (long)dVar8 * 4) = *(float *)(lVar14 + (long)dVar8 * 4) + rVar16;
          negt = -rVar16;
          saxpy_(&n_local,&negt,(real *)addr[(long)dVar8],&i_1,(real *)addr[uVar10],&i_1);
        }
        rVar16 = (real)local_98._0_4_;
      }
      lVar14 = *(long *)((long)local_d8 + uVar15 * 8);
      *(real *)(lVar14 + uVar10 * 4) = rVar16;
      if ((rVar16 != 0.0) || (NAN(rVar16))) {
        uVar5 = (ulong)(uint)n_local;
        if (n_local < 1) {
          uVar5 = 0;
        }
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          *(float *)(addr[uVar10] + uVar6 * 4) =
               *(float *)(addr[uVar10] + uVar6 * 4) * (1.0 / rVar16);
        }
      }
      for (uVar5 = 0; uVar15 != uVar5; uVar5 = uVar5 + 1) {
        fVar18 = *(float *)(lVar14 + uVar5 * 4);
        fVar17 = *(float *)(lVar14 + 4 + uVar5 * 4);
        *(float *)(lVar14 + uVar5 * 4) = local_48[uVar5] * fVar18 + local_50[uVar5] * fVar17;
        *(float *)(lVar14 + 4 + uVar5 * 4) = fVar17 * local_48[uVar5] - fVar18 * local_50[uVar5];
      }
      uVar1 = *(undefined8 *)(lVar14 + uVar15 * 4);
      fVar18 = (float)uVar1;
      fVar17 = (float)((ulong)uVar1 >> 0x20);
      fVar17 = SQRT(fVar17 * fVar17 + fVar18 * fVar18);
      if ((fVar17 != 0.0) || (NAN(fVar17))) {
        local_48[uVar15] = fVar18 / fVar17;
        fVar17 = *(float *)(lVar14 + uVar10 * 4) / fVar17;
      }
      else {
        local_48[uVar15] = 1.0;
        fVar17 = 0.0;
      }
      local_50[uVar15] = fVar17;
      local_b8[uVar10] = -fVar17 * local_b8[uVar15];
      local_b8[uVar15] = local_b8[uVar15] * local_48[uVar15];
      *(float *)(lVar14 + uVar15 * 4) =
           local_48[uVar15] * *(float *)(lVar14 + uVar15 * 4) +
           local_50[uVar15] * *(float *)(lVar14 + uVar10 * 4);
      fVar18 = ABS(local_b8[uVar10]);
      if (fits != (FILE *)0x0) {
        local_98 = ZEXT416((uint)fVar18);
        fprintf((FILE *)fits,"%8d   %10.2e\n",(double)fVar18,(ulong)local_dc);
        fVar18 = (float)local_98._0_4_;
      }
      uVar5 = uVar15;
      if (fVar18 <= local_cc) break;
      local_c8 = (double)((long)local_c8 + 1);
      uVar15 = uVar10;
    } while ((int)local_dc < (int)local_a8);
    pfVar7 = local_58;
    pfVar3 = local_60;
    n_00 = local_68;
    uVar13 = (uint)uVar5;
    iVar4 = uVar13 - (uVar13 == local_ac);
    lVar14 = (long)iVar4;
    local_b8[lVar14] =
         local_b8[lVar14] / *(float *)(*(long *)((long)local_d8 + lVar14 * 8) + lVar14 * 4);
    iVar9 = 0;
    if (0 < iVar4) {
      iVar9 = iVar4;
    }
    for (uVar15 = 1; iVar4 = iVar4 + -1, uVar15 != iVar9 + 1; uVar15 = uVar15 + 1) {
      lVar11 = lVar14 - uVar15;
      fVar18 = local_b8[lVar11];
      for (lVar12 = (long)iVar4; lVar12 < lVar14; lVar12 = lVar12 + 1) {
        fVar18 = fVar18 - *(float *)(*(long *)((long)local_d8 + lVar12 * 8 + 8) + lVar11 * 4) *
                          local_b8[lVar12 + 1];
      }
      local_b8[lVar11] = fVar18 / *(float *)(*(long *)((long)local_d8 + lVar11 * 8) + lVar11 * 4);
    }
    uVar15 = (ulong)(uint)n_local;
    if (n_local < 1) {
      uVar15 = 0;
    }
    for (uVar5 = 0; uVar5 != (uVar13 - (uVar13 == local_ac)) + 1; uVar5 = uVar5 + 1) {
      fVar18 = local_b8[uVar5];
      for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
        local_58[uVar10] =
             *(float *)(*(long *)((long)addr_00 + uVar5 * 8) + uVar10 * 4) * fVar18 +
             local_58[uVar10];
      }
    }
    (*local_80)(1.0,local_58,0.0,(float *)*addr);
    uVar15 = (ulong)(uint)n_local;
    if (n_local < 1) {
      uVar15 = 0;
    }
    for (uVar5 = 0; uVar15 != uVar5; uVar5 = uVar5 + 1) {
      *(float *)(*addr + uVar5 * 4) = pfVar3[uVar5] - *(float *)(*addr + uVar5 * 4);
    }
    rVar16 = snrm2_(&n_local,(real *)*addr,&i_1);
    uVar13 = local_74;
    if ((((double)local_cc / local_88 <= (double)rVar16) || (uVar13 = local_dc, rVar16 <= local_cc))
       || ((int)local_a8 <= (int)local_dc)) break;
  }
  local_dc = uVar13;
  for (lVar14 = 0; lVar14 <= (long)n_00; lVar14 = lVar14 + 1) {
    superlu_free((void *)addr[lVar14]);
  }
  superlu_free(addr);
  for (uVar15 = 0; uVar13 = local_dc, local_a0 != uVar15; uVar15 = uVar15 + 1) {
    superlu_free(*(void **)((long)local_d8 + uVar15 * 8));
    superlu_free(*(void **)((long)addr_00 + uVar15 * 8));
  }
  bVar2 = (int)local_a8 <= (int)local_dc;
  superlu_free(local_d8);
  superlu_free(addr_00);
  superlu_free(local_48);
  superlu_free(local_50);
  superlu_free(local_b8);
  *itmax = uVar13;
  return (int)bVar2;
}

Assistant:

int sfgmr(int n,
     void (*smatvec) (float, float[], float, float[]),
     void (*spsolve) (int, float[], float[]),
     float *rhs, float *sol, double tol, int im, int *itmax, FILE * fits)
{
/*----------------------------------------------------------------------
|                 *** Preconditioned FGMRES ***
+-----------------------------------------------------------------------
| This is a simple version of the ARMS preconditioned FGMRES algorithm.
+-----------------------------------------------------------------------
| Y. S. Dec. 2000. -- Apr. 2008
+-----------------------------------------------------------------------
| on entry:
|----------
|
| rhs     = real vector of length n containing the right hand side.
| sol     = real vector of length n containing an initial guess to the
|           solution on input.
| tol     = tolerance for stopping iteration
| im      = Krylov subspace dimension
| (itmax) = max number of iterations allowed.
| fits    = NULL: no output
|        != NULL: file handle to output " resid vs time and its"
|
| on return:
|----------
| fgmr      int =  0 --> successful return.
|           int =  1 --> convergence not achieved in itmax iterations.
| sol     = contains an approximate solution (upon successful return).
| itmax   = has changed. It now contains the number of steps required
|           to converge --
+-----------------------------------------------------------------------
| internal work arrays:
|----------
| vv      = work array of length [im+1][n] (used to store the Arnoldi
|           basis)
| hh      = work array of length [im][im+1] (Householder matrix)
| z       = work array of length [im][n] to store preconditioned vectors
+-----------------------------------------------------------------------
| subroutines called :
| matvec - matrix-vector multiplication operation
| psolve - (right) preconditioning operation
|	   psolve can be a NULL pointer (GMRES without preconditioner)
+---------------------------------------------------------------------*/

    int maxits = *itmax;
    int its, i_1 = 1, i_2 = 2;
    float eps1 = 0.0;
    float **hh, *c, *s, *rs;
    float **vv, **z;
    float zero = 0.0;
    float one = 1.0;

    its = 0;
    vv = (float **)SUPERLU_MALLOC((im + 1) * sizeof(float *));
    for (int i = 0; i <= im; i++) vv[i] = floatMalloc(n);
    z = (float **)SUPERLU_MALLOC(im * sizeof(float *));
    hh = (float **)SUPERLU_MALLOC(im * sizeof(float *));
    for (int i = 0; i < im; i++)
    {
	hh[i] = floatMalloc(i + 2);
	z[i] = floatMalloc(n);
    }
    c = floatMalloc(im);
    s = floatMalloc(im);
    rs = floatMalloc(im + 1);

    /*---- outer loop starts here ----*/
    do
    {
	/*---- compute initial residual vector ----*/
	smatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    vv[0][j] = rhs[j] - vv[0][j];	/* vv[0]= initial residual */
	float beta = snrm2_(&n, vv[0], &i_1);

	/*---- print info if fits != null ----*/
	if (fits != NULL && its == 0)
	    fprintf(fits, "%8d   %10.2e\n", its, beta);
	/*if ( beta <= tol * dnrm2_(&n, rhs, &i_1) )*/
	if ( !(beta > tol * snrm2_(&n, rhs, &i_1)) )
	    break;
	float t = 1.0 / beta;

	/*---- normalize: vv[0] = vv[0] / beta ----*/
	for (int j = 0; j < n; j++)
	    vv[0][j] = vv[0][j] * t;
	if (its == 0)
	    eps1 = tol * beta;

	/*---- initialize 1-st term of rhs of hessenberg system ----*/
	rs[0] = beta;
	int i = 0;
	for (i = 0; i < im; i++)
	{
	    its++;
	    int i1 = i + 1;

	    /*------------------------------------------------------------
	    |  (Right) Preconditioning Operation   z_{j} = M^{-1} v_{j}
	    +-----------------------------------------------------------*/
	    if (spsolve)
		spsolve(n, z[i], vv[i]);
	    else
		scopy_(&n, vv[i], &i_1, z[i], &i_1);

	    /*---- matvec operation w = A z_{j} = A M^{-1} v_{j} ----*/
	    smatvec(one, z[i], zero, vv[i1]);

	    /*------------------------------------------------------------
	    |     modified gram - schmidt...
	    |     h_{i,j} = (w,v_{i})
	    |     w  = w - h_{i,j} v_{i}
	    +------------------------------------------------------------*/
	    float t0 = snrm2_(&n, vv[i1], &i_1);
	    for (int j = 0; j <= i; j++)
	    {
		float negt;
		float tt = sdot_(&n, vv[j], &i_1, vv[i1], &i_1);
		hh[i][j] = tt;
		negt = -tt;
		saxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
	    }

	    /*---- h_{j+1,j} = ||w||_{2} ----*/
	    t = snrm2_(&n, vv[i1], &i_1);
	    while (t < 0.5 * t0)
	    {
		t0 = t;
		for (int j = 0; j <= i; j++)
		{
		    float negt;
		    float tt = sdot_(&n, vv[j], &i_1, vv[i1], &i_1);
		    hh[i][j] += tt;
		    negt = -tt;
		    saxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
		}
		t = snrm2_(&n, vv[i1], &i_1);
	    }

	    hh[i][i1] = t;

	    if (t != 0.0)
	    {
		/*---- v_{j+1} = w / h_{j+1,j} ----*/
		t = 1.0 / t;
		for (int k = 0; k < n; k++)
		    vv[i1][k] = vv[i1][k] * t;
	    }
	    /*---------------------------------------------------
	    |     done with modified gram schmidt and arnoldi step
	    |     now  update factorization of hh
	    +--------------------------------------------------*/

	    /*--------------------------------------------------------
	    |   perform previous transformations  on i-th column of h
	    +-------------------------------------------------------*/
	    for (int k = 1; k <= i; k++)
	    {
		int k1 = k - 1;
		float tt = hh[i][k1];
		hh[i][k1] = c[k1] * tt + s[k1] * hh[i][k];
		hh[i][k] = -s[k1] * tt + c[k1] * hh[i][k];
	    }

	    float gam = sqrt(pow(hh[i][i], 2) + pow(hh[i][i1], 2));

	    /*---------------------------------------------------
	    |     if gamma is zero then any small value will do
	    |     affect only residual estimate
	    +--------------------------------------------------*/
	    /* if (gam == 0.0) gam = epsmac; */

	    /*---- get next plane rotation ---*/
	    if (gam == 0.0)
	    {
		c[i] = one;
		s[i] = zero;
	    }
            else
	    {
		c[i] = hh[i][i] / gam;
		s[i] = hh[i][i1] / gam;
	    }

	    rs[i1] = -s[i] * rs[i];
	    rs[i] = c[i] * rs[i];

	    /*----------------------------------------------------
	    |   determine residual norm and test for convergence
	    +---------------------------------------------------*/
	    hh[i][i] = c[i] * hh[i][i] + s[i] * hh[i][i1];
	    beta = fabs(rs[i1]);
	    if (fits != NULL)
		fprintf(fits, "%8d   %10.2e\n", its, beta);
	    if (beta <= eps1 || its >= maxits)
		break;
	}

	if (i == im) i--;

	/*---- now compute solution. 1st, solve upper triangular system ----*/
	rs[i] = rs[i] / hh[i][i];

	for (int ii = 1; ii <= i; ii++)
	{
	    int k = i - ii;
	    float tt = rs[k];
	    for (int j = k + 1; j <= i; j++)
		tt = tt - hh[j][k] * rs[j];
	    rs[k] = tt / hh[k][k];
	}

	/*---- linear combination of v[i]'s to get sol. ----*/
	for (int j = 0; j <= i; j++)
	{
	    float tt = rs[j];
	    for (int k = 0; k < n; k++)
		sol[k] += tt * z[j][k];
	}

	/* calculate the residual and output */
	smatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    vv[0][j] = rhs[j] - vv[0][j];	/* vv[0]= initial residual */

	/*---- print info if fits != null ----*/
	beta = snrm2_(&n, vv[0], &i_1);

	/*---- restart outer loop if needed ----*/
	/*if (beta >= eps1 / tol)*/
	if ( !(beta < eps1 / tol) )
	{
	    its = maxits + 10;
	    break;
	}
	if (beta <= eps1)
	    break;
    } while(its < maxits);

    int retval = (its >= maxits);
    for (int i = 0; i <= im; i++)
	SUPERLU_FREE(vv[i]);
    SUPERLU_FREE(vv);
    for (int i = 0; i < im; i++)
    {
	SUPERLU_FREE(hh[i]);
	SUPERLU_FREE(z[i]);
    }
    SUPERLU_FREE(hh);
    SUPERLU_FREE(z);
    SUPERLU_FREE(c);
    SUPERLU_FREE(s);
    SUPERLU_FREE(rs);

    *itmax = its;

    return retval;
}